

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
banksia::ChessBoard::commentEcoString_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ChessBoard *this)

{
  pointer pHVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint uVar2;
  iterator iVar3;
  reference pvVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ecoString;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = ((long)(this->super_BoardCore).histList.
                 super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->super_BoardCore).histList.
                super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x90 & 0xffffffff;
  do {
    uVar5 = uVar5 - 1;
    if ((int)(uint)uVar5 < 0) {
      return __return_storage_ptr__;
    }
    uVar2 = (uint)uVar5 & 0x7fffffff;
    pHVar1 = (this->super_BoardCore).histList.
             super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&ecoMap_abi_cxx11_._M_t,&pHVar1[uVar2].hashKey);
  } while ((_Rb_tree_header *)iVar3._M_node == &ecoMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
          );
  splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ecoString,(string *)&iVar3._M_node[1]._M_parent,';');
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(__return_storage_ptr__,&ecoString);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ecoString);
  __lhs = (__return_storage_ptr__->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(__return_storage_ptr__->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs)) {
    std::operator+(&local_70,__lhs,": ");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(__return_storage_ptr__,1);
    std::operator+(&ecoString,&local_70,pvVar4);
    std::__cxx11::string::~string((string *)&local_70);
    if (0x40 < (ulong)((long)(__return_storage_ptr__->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(__return_storage_ptr__,2);
      std::operator+(&local_70,", ",pvVar4);
      std::__cxx11::string::append((string *)&ecoString);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::append((string *)&pHVar1[uVar2].comment);
    std::__cxx11::string::~string((string *)&ecoString);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ChessBoard::commentEcoString()
{
    std::vector<std::string> vec;
    for(int i = int(histList.size() - 1); i >= 0; i--) {
        auto& hist = histList[i];
        auto it = ecoMap.find(hist.hashKey);
        if (it != ecoMap.end()) {
            vec = splitString(it->second, ';');
            if (vec.size() > 1) {
                auto ecoString = vec.front() + ": " + vec.at(1);
                if (vec.size() > 2) {
                    ecoString += ", " + vec.at(2);
                }
                hist.comment += ecoString;
            }
            return vec;
        }
    }
    return vec;
}